

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O0

void * dequeue(Queue *q)

{
  node *__ptr;
  void *data;
  node *temp;
  Queue *q_local;
  
  if (0 < q->sizeOfQueue) {
    __ptr = q->head;
    if (q->sizeOfQueue < 2) {
      q->head = (node *)0x0;
      q->tail = (node *)0x0;
    }
    else {
      q->head = q->head->next;
    }
    q->sizeOfQueue = q->sizeOfQueue + -1;
    q_local = (Queue *)__ptr->data;
    free(__ptr);
  }
  return q_local;
}

Assistant:

void *dequeue(Queue *q) {
    if (q->sizeOfQueue > 0) {
        node *temp = q->head;

        if (q->sizeOfQueue > 1) {
            q->head = q->head->next;
        } else {
            q->head = NULL;
            q->tail = NULL;
        }

        q->sizeOfQueue--;
        void *data = temp->data;
        free(temp);
        return data;
    }
}